

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int exprVectorRegister(Parse *pParse,Expr *pVector,int iField,int regSelect,Expr **ppExpr,
                      int *pRegFree)

{
  u8 uVar1;
  Expr *pEVar2;
  int iVar3;
  
  uVar1 = pVector->op;
  if (uVar1 == 0x8b) {
    *ppExpr = ((pVector->x).pSelect)->pEList->a[iField].pExpr;
    iVar3 = regSelect + iField;
  }
  else {
    if (uVar1 == 0xb1) {
      pEVar2 = ((pVector->x).pList)->a[iField].pExpr;
      *ppExpr = pEVar2;
      iVar3 = sqlite3ExprCodeTemp(pParse,pEVar2,pRegFree);
      return iVar3;
    }
    iVar3 = 0;
    if (uVar1 == 0xb0) {
      pEVar2 = sqlite3VectorFieldSubexpr(pVector,iField);
      *ppExpr = pEVar2;
      iVar3 = iField + pVector->iTable;
    }
  }
  return iVar3;
}

Assistant:

static int exprVectorRegister(
  Parse *pParse,                  /* Parse context */
  Expr *pVector,                  /* Vector to extract element from */
  int iField,                     /* Field to extract from pVector */
  int regSelect,                  /* First in array of registers */
  Expr **ppExpr,                  /* OUT: Expression element */
  int *pRegFree                   /* OUT: Temp register to free */
){
  u8 op = pVector->op;
  assert( op==TK_VECTOR || op==TK_REGISTER || op==TK_SELECT || op==TK_ERROR );
  if( op==TK_REGISTER ){
    *ppExpr = sqlite3VectorFieldSubexpr(pVector, iField);
    return pVector->iTable+iField;
  }
  if( op==TK_SELECT ){
    assert( ExprUseXSelect(pVector) );
    *ppExpr = pVector->x.pSelect->pEList->a[iField].pExpr;
     return regSelect+iField;
  }
  if( op==TK_VECTOR ){
    assert( ExprUseXList(pVector) );
    *ppExpr = pVector->x.pList->a[iField].pExpr;
    return sqlite3ExprCodeTemp(pParse, *ppExpr, pRegFree);
  }
  return 0;
}